

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyCountItems(char *pBeg,char *pEnd)

{
  bool local_1d;
  int local_1c;
  int Counter;
  char *pEnd_local;
  char *pBeg_local;
  
  local_1c = 0;
  for (pEnd_local = pBeg; pEnd_local < pEnd; pEnd_local = pEnd_local + 1) {
    local_1d = true;
    if (*pEnd_local != '(') {
      local_1d = *pEnd_local == ':';
    }
    local_1c = (uint)local_1d + local_1c;
  }
  return local_1c;
}

Assistant:

int Scl_LibertyCountItems( char * pBeg, char * pEnd )
{
    int Counter = 0;
    for ( ; pBeg < pEnd; pBeg++ )
        Counter += (*pBeg == '(' || *pBeg == ':');
    return Counter;
}